

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbiftad.cpp
# Opt level: O3

void CVmBifTADS::gettime(uint argc)

{
  int iVar1;
  vm_obj_id_t obj;
  unsigned_long uVar2;
  time_t in_stack_00000050;
  
  CVmBif::check_argc_range(argc,0,1);
  if (argc == 1) {
    iVar1 = CVmBif::pop_int_val();
    if (iVar1 == 2) {
      uVar2 = os_get_sys_clock_ms();
      if (gettime(unsigned_int)::t_zero_set == '\x01') {
        iVar1 = (int)gettime::t_zero;
      }
      else {
        gettime(unsigned_int)::t_zero_set = '\x01';
        iVar1 = (int)uVar2;
        gettime::t_zero = uVar2;
      }
      CVmBif::retval_int((ulong)((int)uVar2 - iVar1 & 0x7fffffff));
      return;
    }
    if (iVar1 != 1) {
      err_throw(0x902);
    }
  }
  time((time_t *)0x0);
  obj = format_datetime_list(in_stack_00000050);
  CVmBif::retval_obj(obj);
  return;
}

Assistant:

void CVmBifTADS::gettime(VMG_ uint argc)
{
    /* check arguments */
    check_argc_range(vmg_ argc, 0, 1);

    /* if there's an argument, get the type of time value to return */
    int typ;
    if (argc == 1)
    {
        /* get the time type code */
        typ = pop_int_val(vmg0_);
    }
    else
    {
        /* use the default type */
        typ = 1;
    }